

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O0

MatrixFixSize<4U,_3U> * iDynTree::Rotation::QuaternionRightTrivializedDerivative(Vector4 quaternion)

{
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>_>_>
  *in_RDI;
  MatrixFixSize<4U,_3U> *outputMatrix;
  Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_> map;
  Block<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true>
  *in_stack_fffffffffffffda0;
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>
  *this;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>_>_>
  *n;
  MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *in_stack_fffffffffffffdb8;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_true>_>
  *in_stack_fffffffffffffdc0;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffdc8;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffdd0;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>
  *in_stack_fffffffffffffec8;
  
  this = (DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>
          *)&stack0x00000008;
  n = in_RDI;
  MatrixFixSize<4U,_3U>::MatrixFixSize((MatrixFixSize<4U,_3U> *)in_RDI);
  toEigen<4u,3u>((MatrixFixSize<4U,_3U> *)in_stack_fffffffffffffdb8);
  toEigen<4U>((VectorFixSize<4U> *)in_stack_fffffffffffffdb8);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  tail<3>((DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_> *)
          in_stack_fffffffffffffdb8,(Index)n);
  Eigen::
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>
  ::transpose(this);
  Eigen::
  DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>_>
  ::operator-((DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>_>
               *)in_stack_fffffffffffffdb8);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>_>::
  topRows<1>(in_stack_fffffffffffffdc8,(Index)in_stack_fffffffffffffdc0);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,4,3,1,4,3>,0,Eigen::Stride<0,0>>,1,3,true>::operator=
            (in_stack_fffffffffffffda0,in_RDI);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>_>::
  bottomRows<3>(in_stack_fffffffffffffdc8,(Index)in_stack_fffffffffffffdc0);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_true>_>
  ::setIdentity((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_true>_>
                 *)0x6c8cc2);
  VectorFixSize<4U>::operator()((VectorFixSize<4U> *)this,0);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>_>::
  bottomRows<3>(in_stack_fffffffffffffdc8,(Index)in_stack_fffffffffffffdc0);
  Eigen::
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_true>_>
  ::operator*=((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_true>_>
                *)in_stack_fffffffffffffdd0,(Scalar *)in_stack_fffffffffffffdc8);
  toEigen<4U>((VectorFixSize<4U> *)in_stack_fffffffffffffdb8);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  tail<3>((DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_> *)
          in_stack_fffffffffffffdb8,(Index)n);
  skew<Eigen::Block<Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>,3,1,false>>
            (in_stack_fffffffffffffec8);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>_>::
  bottomRows<3>(in_stack_fffffffffffffdc8,(Index)in_stack_fffffffffffffdc0);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,4,3,1,4,3>,0,Eigen::Stride<0,0>>,3,3,true>>
  ::operator-=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>_>::
  operator*=(in_stack_fffffffffffffdd0,(Scalar *)in_stack_fffffffffffffdc8);
  return (MatrixFixSize<4U,_3U> *)n;
}

Assistant:

MatrixFixSize<4, 3> Rotation::QuaternionRightTrivializedDerivative(Vector4 quaternion)
    {
        MatrixFixSize<4, 3> outputMatrix;
        Eigen::Map<Eigen::Matrix<double, 4, 3, Eigen::RowMajor> > map = iDynTree::toEigen(outputMatrix);
        map.topRows<1>() = -iDynTree::toEigen(quaternion).tail<3>().transpose();
        map.bottomRows<3>().setIdentity();
        map.bottomRows<3>() *= quaternion(0);
        map.bottomRows<3>() -= iDynTree::skew(iDynTree::toEigen(quaternion).tail<3>());
        map *= 0.5;
        return outputMatrix;
    }